

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_seed
              (mbedtls_hmac_drbg_context *ctx,mbedtls_md_info_t *md_info,
              _func_int_void_ptr_uchar_ptr_size_t *f_entropy,void *p_entropy,uchar *custom,
              size_t len)

{
  byte bVar1;
  ulong keylen;
  int local_5c;
  size_t md_size;
  size_t entropy_len;
  int ret;
  size_t len_local;
  uchar *custom_local;
  void *p_entropy_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_entropy_local;
  mbedtls_md_info_t *md_info_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  ctx_local._4_4_ = mbedtls_md_setup(&ctx->md_ctx,md_info,1);
  if (ctx_local._4_4_ == 0) {
    bVar1 = mbedtls_md_get_size(md_info);
    keylen = (ulong)bVar1;
    mbedtls_md_hmac_starts(&ctx->md_ctx,ctx->V,keylen);
    memset(ctx->V,1,keylen);
    ctx->f_entropy = f_entropy;
    ctx->p_entropy = p_entropy;
    ctx->reseed_interval = 10000;
    if (keylen < 0x15) {
      local_5c = 0x10;
    }
    else {
      local_5c = 0x20;
      if (keylen < 0x1d) {
        local_5c = 0x18;
      }
    }
    ctx->entropy_len = (ulong)((long)local_5c * 3) >> 1;
    ctx_local._4_4_ = mbedtls_hmac_drbg_reseed(ctx,custom,len);
    if (ctx_local._4_4_ == 0) {
      ctx->entropy_len = (long)local_5c;
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_seed( mbedtls_hmac_drbg_context *ctx,
                    const mbedtls_md_info_t * md_info,
                    int (*f_entropy)(void *, unsigned char *, size_t),
                    void *p_entropy,
                    const unsigned char *custom,
                    size_t len )
{
    int ret;
    size_t entropy_len, md_size;

    if( ( ret = mbedtls_md_setup( &ctx->md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    md_size = mbedtls_md_get_size( md_info );

    /*
     * Set initial working state.
     * Use the V memory location, which is currently all 0, to initialize the
     * MD context with an all-zero key. Then set V to its initial value.
     */
    mbedtls_md_hmac_starts( &ctx->md_ctx, ctx->V, md_size );
    memset( ctx->V, 0x01, md_size );

    ctx->f_entropy = f_entropy;
    ctx->p_entropy = p_entropy;

    ctx->reseed_interval = MBEDTLS_HMAC_DRBG_RESEED_INTERVAL;

    /*
     * See SP800-57 5.6.1 (p. 65-66) for the security strength provided by
     * each hash function, then according to SP800-90A rev1 10.1 table 2,
     * min_entropy_len (in bits) is security_strength.
     *
     * (This also matches the sizes used in the NIST test vectors.)
     */
    entropy_len = md_size <= 20 ? 16 : /* 160-bits hash -> 128 bits */
                  md_size <= 28 ? 24 : /* 224-bits hash -> 192 bits */
                                  32;  /* better (256+) -> 256 bits */

    /*
     * For initialisation, use more entropy to emulate a nonce
     * (Again, matches test vectors.)
     */
    ctx->entropy_len = entropy_len * 3 / 2;

    if( ( ret = mbedtls_hmac_drbg_reseed( ctx, custom, len ) ) != 0 )
        return( ret );

    ctx->entropy_len = entropy_len;

    return( 0 );
}